

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

xpath_node pugi::impl::anon_unknown_0::xpath_first(xpath_node *begin,xpath_node *end,type_t type)

{
  xpath_node xVar1;
  bool bVar2;
  xpath_node *pxVar3;
  undefined4 in_register_00000014;
  xpath_node *extraout_RDX;
  xpath_node *this;
  xpath_node local_28;
  
  pxVar3 = (xpath_node *)CONCAT44(in_register_00000014,type);
  if (begin != end) {
    if (type == type_unsorted) {
      this = begin + 1;
      for (; this != end; this = this + 1) {
        bVar2 = document_order_comparator::operator()
                          ((document_order_comparator *)this,begin,pxVar3);
        pxVar3 = this;
        if (!bVar2) {
          pxVar3 = begin;
        }
        begin = pxVar3;
        pxVar3 = extraout_RDX;
      }
      local_28._node._root._0_4_ = *(undefined4 *)&(begin->_node)._root;
      local_28._node._root._4_4_ = *(undefined4 *)((long)&(begin->_node)._root + 4);
      local_28._attribute._attr._0_4_ = *(undefined4 *)&(begin->_attribute)._attr;
      local_28._attribute._attr._4_4_ = *(undefined4 *)((long)&(begin->_attribute)._attr + 4);
      goto LAB_00706ce7;
    }
    if (type == type_sorted_reverse) {
      local_28._node._root._0_4_ = *(undefined4 *)&end[-1]._node._root;
      local_28._node._root._4_4_ = *(undefined4 *)((long)&end[-1]._node._root + 4);
      local_28._attribute._attr._0_4_ = *(undefined4 *)&end[-1]._attribute._attr;
      local_28._attribute._attr._4_4_ = *(undefined4 *)((long)&end[-1]._attribute._attr + 4);
      goto LAB_00706ce7;
    }
    if (type == type_sorted) {
      local_28._node._root._0_4_ = *(undefined4 *)&(begin->_node)._root;
      local_28._node._root._4_4_ = *(undefined4 *)((long)&(begin->_node)._root + 4);
      local_28._attribute._attr._0_4_ = *(undefined4 *)&(begin->_attribute)._attr;
      local_28._attribute._attr._4_4_ = *(undefined4 *)((long)&(begin->_attribute)._attr + 4);
      goto LAB_00706ce7;
    }
  }
  xpath_node::xpath_node(&local_28);
LAB_00706ce7:
  xVar1._node._root._4_4_ = local_28._node._root._4_4_;
  xVar1._node._root._0_4_ = local_28._node._root._0_4_;
  xVar1._attribute._attr._0_4_ = local_28._attribute._attr._0_4_;
  xVar1._attribute._attr._4_4_ = local_28._attribute._attr._4_4_;
  return xVar1;
}

Assistant:

PUGI_IMPL_FN xpath_node xpath_first(const xpath_node* begin, const xpath_node* end, xpath_node_set::type_t type)
	{
		if (begin == end) return xpath_node();

		switch (type)
		{
		case xpath_node_set::type_sorted:
			return *begin;

		case xpath_node_set::type_sorted_reverse:
			return *(end - 1);

		case xpath_node_set::type_unsorted:
			return *min_element(begin, end, document_order_comparator());

		default:
			assert(false && "Invalid node set type"); // unreachable
			return xpath_node();
		}
	}